

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_req.cxx
# Opt level: O0

ptr<snapshot_sync_req> nuraft::snapshot_sync_req::deserialize(buffer_serializer *bs)

{
  uint8_t uVar1;
  size_t sVar2;
  size_t sVar3;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  buffer_serializer *in_RSI;
  element_type *in_RDI;
  ptr<snapshot_sync_req> pVar4;
  size_t in_stack_00000078;
  size_t sz;
  ptr<buffer> b;
  byte *src;
  bool done;
  ulong offset;
  ptr<snapshot> snp;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffff28;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffff30;
  shared_ptr<nuraft::buffer> *in_stack_ffffffffffffff38;
  buffer_serializer *in_stack_ffffffffffffff40;
  shared_ptr<nuraft::snapshot> *in_stack_ffffffffffffff48;
  buffer_serializer *in_stack_ffffffffffffff50;
  buffer_serializer *in_stack_ffffffffffffff60;
  shared_ptr<nuraft::buffer> local_68;
  size_t local_58;
  shared_ptr<nuraft::buffer> local_50;
  void *local_40;
  undefined1 local_35;
  uint64_t local_28;
  buffer_serializer *local_10;
  
  local_10 = in_RSI;
  snapshot::deserialize((buffer_serializer *)in_RDI);
  local_28 = buffer_serializer::get_u64(in_stack_ffffffffffffff60);
  uVar1 = buffer_serializer::get_u8(in_stack_ffffffffffffff50);
  local_35 = uVar1 == '\x01';
  local_40 = buffer_serializer::data(in_stack_ffffffffffffff40);
  std::shared_ptr<nuraft::buffer>::shared_ptr((shared_ptr<nuraft::buffer> *)0x4d1a59);
  sVar2 = buffer_serializer::pos(local_10);
  sVar3 = buffer_serializer::size((buffer_serializer *)0x4d1a7a);
  if (sVar2 < sVar3) {
    in_stack_ffffffffffffff48 =
         (shared_ptr<nuraft::snapshot> *)buffer_serializer::size((buffer_serializer *)0x4d1aa1);
    in_stack_ffffffffffffff40 = (buffer_serializer *)buffer_serializer::pos(local_10);
    local_58 = (long)in_stack_ffffffffffffff48 - (long)in_stack_ffffffffffffff40;
    nuraft::buffer::alloc(in_stack_00000078);
    in_stack_ffffffffffffff30 = &local_50;
    std::shared_ptr<nuraft::buffer>::operator=(in_stack_ffffffffffffff30,&local_68);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x4d1b09);
    this = std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4d1b13);
    in_stack_ffffffffffffff38 = (shared_ptr<nuraft::buffer> *)nuraft::buffer::data(this);
    memcpy(in_stack_ffffffffffffff38,local_40,local_58);
  }
  else {
    nuraft::buffer::alloc(in_stack_00000078);
    std::shared_ptr<nuraft::buffer>::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x4d1ba6);
  }
  cs_new<nuraft::snapshot_sync_req,std::shared_ptr<nuraft::snapshot>&,unsigned_long&,std::shared_ptr<nuraft::buffer>&,bool&>
            (in_stack_ffffffffffffff48,(unsigned_long *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,(bool *)in_stack_ffffffffffffff30);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x4d1bdf);
  std::shared_ptr<nuraft::snapshot>::~shared_ptr((shared_ptr<nuraft::snapshot> *)0x4d1bec);
  pVar4.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  pVar4.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<snapshot_sync_req>)
         pVar4.super___shared_ptr<nuraft::snapshot_sync_req,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot_sync_req> snapshot_sync_req::deserialize(buffer_serializer& bs) {
    ptr<snapshot> snp(snapshot::deserialize(bs));
    ulong offset = bs.get_u64();
    bool done = bs.get_u8() == 1;
    byte* src = (byte*)bs.data();
    ptr<buffer> b;
    if (bs.pos() < bs.size()) {
        size_t sz = bs.size() - bs.pos();
        b = buffer::alloc(sz);
        ::memcpy(b->data(), src, sz);
    }
    else {
        b = buffer::alloc(0);
    }

    return cs_new<snapshot_sync_req>(snp, offset, b, done);
}